

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall vkt::sr::ShaderEvalContext::reset(ShaderEvalContext *this,float sx,float sy)

{
  undefined1 local_60 [24];
  int attribNdx;
  int numAttribs;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  pointer local_20;
  float local_18;
  float local_14;
  float sy_local;
  float sx_local;
  ShaderEvalContext *this_local;
  
  local_18 = sy;
  local_14 = sx;
  _sy_local = this;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_28,0.0,0.0,0.0,1.0);
  *(pointer *)(this->color).m_data = local_28;
  *(pointer *)((this->color).m_data + 2) = local_20;
  this->isDiscarded = false;
  QuadGrid::getCoords((QuadGrid *)&local_38,local_14,local_18);
  *(pointer *)(this->coords).m_data = local_38;
  *(pointer *)((this->coords).m_data + 2) = local_30;
  QuadGrid::getUnitCoords((QuadGrid *)&attribNdx,local_14,local_18);
  (this->unitCoords).m_data[0] = (float)attribNdx;
  (this->unitCoords).m_data[1] = (float)numAttribs;
  *(pointer *)((this->unitCoords).m_data + 2) = local_40;
  local_60._20_4_ = QuadGrid::getNumUserAttribs(this->m_quadGrid);
  for (local_60._16_4_ = 0.0; (int)local_60._16_4_ < (int)local_60._20_4_;
      local_60._16_4_ = local_60._16_4_ + 1) {
    QuadGrid::getUserAttrib((QuadGrid *)local_60,(int)this->m_quadGrid,local_14,local_18);
    *(undefined8 *)this->in[(int)local_60._16_4_].m_data = local_60._0_8_;
    *(undefined8 *)(this->in[(int)local_60._16_4_].m_data + 2) = local_60._8_8_;
  }
  return;
}

Assistant:

void ShaderEvalContext::reset (float sx, float sy)
{
	// Clear old values
	color		= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	isDiscarded	= false;

	// Compute coords
	coords		= m_quadGrid.getCoords(sx, sy);
	unitCoords	= m_quadGrid.getUnitCoords(sx, sy);

	// Compute user attributes.
	const int numAttribs = m_quadGrid.getNumUserAttribs();
	DE_ASSERT(numAttribs <= MAX_USER_ATTRIBS);
	for (int attribNdx = 0; attribNdx < numAttribs; attribNdx++)
		in[attribNdx] = m_quadGrid.getUserAttrib(attribNdx, sx, sy);
}